

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::AuthenticatedStream>
kj::anon_unknown_0::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs,bool authenticated)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar2;
  PromiseBase PVar3;
  OwnPromiseNode OVar4;
  char cVar5;
  void *pvVar6;
  char (*pacVar7) [37];
  char (*params) [37];
  SocketAddress *pSVar8;
  undefined7 in_register_00000081;
  unsigned_long uVar9;
  TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1647:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1656:8)>
  *location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_6d0;
  LowLevelAsyncIoProvider local_6c8;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  PromiseBase local_6b0;
  OwnPromiseNode local_6a8;
  Array<char> local_6a0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_688;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Exception local_1c0;
  
  uVar9 = CONCAT71(in_register_00000081,authenticated);
  pacVar7 = (char (*) [37])addrs.size_;
  pSVar8 = addrs.ptr;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = uVar9 != 0;
  local_6b0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)lowLevel;
  _kjCondition.left = uVar9;
  if (_kjCondition.result) {
    local_6d0.ptr = (PromiseNode *)0x0;
    params = pacVar7;
    cVar5 = (*(code *)**(undefined8 **)pSVar8)(pSVar8,*pacVar7 + 8,*(undefined4 *)*pacVar7);
    if (cVar5 == '\0') {
      kj::_::Debug::makeDescription<char_const(&)[37]>
                ((String *)&local_6a0,(Debug *)"\"connect() blocked by restrictPeers()\"",
                 "connect() blocked by restrictPeers()",params);
      Exception::Exception
                (&local_1c0,FAILED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x669,(String *)&local_6a0);
      Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise
                ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_6c8,&local_1c0);
      Exception::~Exception(&local_1c0);
      Array<char>::~Array(&local_6a0);
    }
    else {
      SocketAddress::socket((SocketAddress *)&local_1c0,(int)addrs.size_,1,(int)params);
      LowLevelAsyncIoProvider::wrapConnectingSocketFd
                (&local_6c8,(OwnFd *)filter,(sockaddr *)&local_1c0,(uint)(*pacVar7 + 8),
                 *(uint *)*pacVar7);
      OwnFd::~OwnFd((OwnFd *)&local_1c0);
    }
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              (&local_6d0,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_6c8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_6c8);
    f.exception = f.exception & 0xffffffffffffff00;
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition,(NullableValue<kj::Exception> *)&f);
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
    if ((char)_kjCondition.left == '\x01') {
      Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise
                ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&f,
                 (Exception *)&_kjCondition.right);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                (&local_6d0,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition);
    OVar2.ptr = local_6d0.ptr;
    continuationTracePtr =
         kj::_::
         TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1647:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1656:8)>
         ::anon_class_40_4_9eb916ad_for_func::operator();
    pPVar1 = ((local_6d0.ptr)->super_PromiseArenaMember).arena;
    f.exception = (Exception *)filter;
    _kjCondition.left = (unsigned_long)filter;
    _kjCondition._8_8_ = pSVar8;
    _kjCondition.op.content.ptr = (char *)pacVar7;
    _kjCondition.op.content.size_ = uVar9;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_6d0.ptr - (long)pPVar1) < 0x70) {
      pvVar6 = operator_new(0x400);
      location_00 = (TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1647:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1656:8)>
                     *)((long)pvVar6 + 0x390);
      ctor<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Own<kj::AsyncIoStream,decltype(nullptr)>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Own<kj::AsyncIoStream,decltype(nullptr)>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_6d0,(anon_class_40_4_9eb916ad_for_func *)&_kjCondition,
                 (anon_class_40_4_9eb916ad_for_errorHandler *)&f,&continuationTracePtr);
      *(void **)((long)pvVar6 + 0x398) = pvVar6;
    }
    else {
      ((local_6d0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1647:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1656:8)>
                     *)(local_6d0.ptr + -7);
      ctor<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Own<kj::AsyncIoStream,decltype(nullptr)>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Own<kj::AsyncIoStream,decltype(nullptr)>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_6d0,(anon_class_40_4_9eb916ad_for_func *)&_kjCondition,
                 (anon_class_40_4_9eb916ad_for_errorHandler *)&f,&continuationTracePtr);
      OVar2.ptr[-7].super_PromiseArenaMember.arena = pPVar1;
    }
    location.function = "connectImpl";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
    ;
    location.lineNumber = 0x667;
    location.columnNumber = 0xc;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<kj::AuthenticatedStream>
              (&local_6a8,(Promise<kj::AuthenticatedStream> *)&intermediate,location);
    OVar4.ptr = local_6a8.ptr;
    local_6a8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_6a8);
    PVar3.node.ptr = local_6b0.node.ptr;
    *(PromiseNode **)local_6b0.node.ptr = OVar4.ptr;
    local_688.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_688);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_6d0);
    return (Promise<kj::AuthenticatedStream>)(PromiseNode *)PVar3.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x665,FAILED,"addrs.size() > 0","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static Promise<AuthenticatedStream> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs,
      bool authenticated) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        auto fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            kj::mv(fd), addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([&lowLevel,&filter,addrs,authenticated](Own<AsyncIoStream>&& stream)
        -> Promise<AuthenticatedStream> {
      // Success, pass along.
      AuthenticatedStream result;
      result.stream = kj::mv(stream);
      if (authenticated) {
        result.peerIdentity = addrs[0].getIdentity(lowLevel, filter, *result.stream);
      }
      return kj::mv(result);
    }, [&lowLevel,&filter,addrs,authenticated](Exception&& exception) mutable
        -> Promise<AuthenticatedStream> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()), authenticated);
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }